

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
::~btree(btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
         *this)

{
  clear(this);
  return;
}

Assistant:

~btree() {
            // Put static_asserts in destructor to avoid triggering them before the type
            // is complete.
            static_assert(static_assert_validation(), "This call must be elided.");
            clear();
        }